

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::ContinuousAssignSymbol::getAssignment(ContinuousAssignSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  LookupLocation LVar4;
  ASTContext context;
  
  if (this->assign != (Expression *)0x0) {
    return this->assign;
  }
  pSVar1 = (this->super_Symbol).parentScope;
  pSVar2 = (this->super_Symbol).originatingSyntax;
  LVar4 = LookupLocation::after(&this->super_Symbol);
  context.lookupIndex = LVar4.index;
  context.flags.m_bits = 0x20;
  context.instanceOrProc = (Symbol *)0x0;
  context.firstTempVar = (TempVarSymbol *)0x0;
  context.randomizeDetails = (RandomizeDetails *)0x0;
  context.assertionInstance = (AssertionInstanceDetails *)0x0;
  context.scope.ptr = pSVar1;
  iVar3 = Expression::bind((int)pSVar2,(sockaddr *)&context,8);
  this->assign = (Expression *)CONCAT44(extraout_var,iVar3);
  return (Expression *)CONCAT44(extraout_var,iVar3);
}

Assistant:

const Expression& ContinuousAssignSymbol::getAssignment() const {
    if (assign)
        return *assign;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    ASTContext context(*scope, LookupLocation::after(*this), ASTFlags::NonProcedural);
    assign = &Expression::bind(syntax->as<ExpressionSyntax>(), context,
                               ASTFlags::AssignmentAllowed);

    return *assign;
}